

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O0

FuncInfo * __thiscall Scope::GetEnclosingFunc(Scope *this)

{
  code *pcVar1;
  undefined4 *puVar2;
  bool bVar3;
  Scope *local_18;
  Scope *scope;
  Scope *this_local;
  
  local_18 = this;
  while( true ) {
    bVar3 = false;
    if (local_18 != (Scope *)0x0) {
      bVar3 = local_18->func == (FuncInfo *)0x0;
    }
    if (!bVar3) break;
    local_18 = GetEnclosingScope(local_18);
  }
  if (local_18 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar2 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/Scope.h"
                       ,0xe4,"(scope)","scope");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar2 = 0;
  }
  return local_18->func;
}

Assistant:

FuncInfo *GetEnclosingFunc()
    {
        Scope *scope = this;
        while (scope && scope->func == nullptr)
        {
            scope = scope->GetEnclosingScope();
        }
        AnalysisAssert(scope);
        return scope->func;
    }